

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O0

list<SectionInfo,_std::allocator<SectionInfo>_> * __thiscall
ArgsManager::GetUnrecognizedSections_abi_cxx11_(ArgsManager *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  int iVar1;
  undefined8 in_RSI;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  list<SectionInfo,_std::allocator<SectionInfo>_> *unrecognized;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffebb;
  int in_stack_fffffffffffffebc;
  char *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  allocator_type *in_stack_fffffffffffffed0;
  allocator_type *in_stack_fffffffffffffed8;
  allocator_type *in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  ChainType chain;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *__comp;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_ba [18];
  allocator_type local_a8 [160];
  long local_8;
  
  chain = (ChainType)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  if ((GetUnrecognizedSections[abi:cxx11]()::available_sections_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&GetUnrecognizedSections[abi:cxx11]()::
                                   available_sections_abi_cxx11_), iVar1 != 0)) {
    ChainTypeToString_abi_cxx11_(chain);
    ChainTypeToString_abi_cxx11_(chain);
    ChainTypeToString_abi_cxx11_(chain);
    ChainTypeToString_abi_cxx11_(chain);
    ChainTypeToString_abi_cxx11_(chain);
    __comp = local_ba;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffffe98);
    __l._M_len._0_4_ = in_stack_ffffffffffffff08;
    __l._M_array = (iterator)in_RSI;
    __l._M_len._4_4_ = in_stack_ffffffffffffff0c;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set(this_00,__l,__comp,in_stack_fffffffffffffee0);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffe98);
    in_stack_fffffffffffffed8 = local_a8;
    in_stack_fffffffffffffed0 = (allocator_type *)&local_8;
    do {
      in_stack_fffffffffffffed0 = in_stack_fffffffffffffed0 + -0x20;
      std::__cxx11::string::~string(in_stack_fffffffffffffe98);
    } while (in_stack_fffffffffffffed0 != in_stack_fffffffffffffed8);
    in_stack_fffffffffffffee0 = in_stack_fffffffffffffed0;
    __cxa_atexit(std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::~set,&GetUnrecognizedSections[abi:cxx11]()::available_sections_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetUnrecognizedSections[abi:cxx11]()::available_sections_abi_cxx11_);
  }
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffe98);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffed8,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffed0,
             in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,
             (bool)in_stack_fffffffffffffebb);
  std::__cxx11::list<SectionInfo,_std::allocator<SectionInfo>_>::list
            ((list<SectionInfo,_std::allocator<SectionInfo>_> *)in_stack_fffffffffffffee0,
             (list<SectionInfo,_std::allocator<SectionInfo>_> *)in_stack_fffffffffffffed8);
  std::__cxx11::list<SectionInfo,std::allocator<SectionInfo>>::
  remove_if<ArgsManager::GetUnrecognizedSections()const::__0>
            ((list<SectionInfo,_std::allocator<SectionInfo>_> *)this_00);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffe98);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (list<SectionInfo,_std::allocator<SectionInfo>_> *)in_RDI;
}

Assistant:

std::list<SectionInfo> ArgsManager::GetUnrecognizedSections() const
{
    // Section names to be recognized in the config file.
    static const std::set<std::string> available_sections{
        ChainTypeToString(ChainType::REGTEST),
        ChainTypeToString(ChainType::SIGNET),
        ChainTypeToString(ChainType::TESTNET),
        ChainTypeToString(ChainType::TESTNET4),
        ChainTypeToString(ChainType::MAIN),
    };

    LOCK(cs_args);
    std::list<SectionInfo> unrecognized = m_config_sections;
    unrecognized.remove_if([](const SectionInfo& appeared){ return available_sections.find(appeared.m_name) != available_sections.end(); });
    return unrecognized;
}